

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalization.hpp
# Opt level: O1

Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
* __thiscall
Kernel::InequalityNormalizer::tryNormalizeInterpreted
          (Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           *__return_storage_ptr__,InequalityNormalizer *this,Literal *lit)

{
  anon_class_24_3_7672fa5b clsr;
  anon_class_24_3_7672fa5b clsr_00;
  Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> out;
  anon_class_1_0_00000001 wrapCoproduct;
  anon_class_16_2_20c7215e local_f0;
  Literal **local_e0;
  OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_d8;
  Literal *local_b8;
  Option<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_b0;
  Literal *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_68;
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_48;
  
  local_f0.lit = &local_90;
  local_f0.this = this;
  local_b8 = lit;
  local_90 = lit;
  tryNormalizeInterpreted<Kernel::NumTraits<Kernel::IntegerConstantType>_>::anon_class_16_2_20c7215e
  ::operator()(&local_b0,&local_f0);
  if (local_b0.
      super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
      _isSome == true) {
    local_d8._isSome = true;
    local_d8._elem._elem._0_4_ =
         local_b0.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
         _elem._elem.init._term._id << 8;
    local_d8._elem._elem._4_4_ =
         local_b0.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
         _elem._elem.init._term._id >> 0x18;
    local_d8._elem._elem._9_3_ =
         SUB83(local_b0.
               super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
               ._elem._elem.init._term._ptr,0);
    local_d8._elem._elem._8_4_ = (uint)(uint3)local_d8._elem._elem._9_3_ << 8;
    local_d8._elem._elem._12_4_ =
         (undefined4)
         ((ulong)local_b0.
                 super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
                 ._elem._elem._8_8_ >> 0x18);
    local_d8._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] =
         (char)((ulong)local_b0.
                       super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
                       ._elem._elem._8_8_ >> 0x38);
    local_d8._elem._elem._17_3_ =
         (undefined3)
         local_b0.
         super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>.
         _elem._elem.init._symbol;
    local_d8._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] =
         (char)((uint)local_b0.
                      super_OptionBase<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
                      ._elem._elem._16_4_ >> 0x18);
  }
  else {
    local_d8._elem._elem._12_4_ = 0;
    local_d8._elem._elem._16_4_ = 0;
    local_d8._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = '\0';
    local_d8._isSome = false;
    local_d8._1_3_ = 0;
    local_d8._elem._elem._0_4_ = 0;
    local_d8._elem._elem._4_4_ = 0;
    local_d8._elem._elem._8_4_ = 0;
  }
  local_d8._elem._elem._21_7_ = 0;
  clsr.this = this;
  clsr.wrapCoproduct = (anon_class_1_0_00000001 *)&local_90;
  clsr.lit = &local_b8;
  local_f0.lit = &local_90;
  local_f0.this = this;
  local_e0 = &local_b8;
  ::Lib::
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::
  orElse<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Normalization_hpp:335:12),_true>
            (&local_68,
             (Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              *)&local_d8,clsr);
  clsr_00.this = this;
  clsr_00.wrapCoproduct = (anon_class_1_0_00000001 *)&local_90;
  clsr_00.lit = &local_b8;
  local_f0.lit = &local_90;
  local_f0.this = this;
  local_e0 = &local_b8;
  ::Lib::
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::
  orElse<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Normalization_hpp:336:12),_true>
            (&local_48,&local_68,clsr_00);
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  ::Lib::
  Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::
  orElse<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Option_hpp:505:30),_true>
            (__return_storage_ptr__,&local_48,
             (Option<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

Option<AnyAlascaLiteral> tryNormalizeInterpreted(Literal* lit) const
    {
      using Out = AnyAlascaLiteral;
      auto wrapCoproduct = [](auto&& norm) {
        return std::move(norm).map([](auto x) { return Out(x); });
      };
      return             wrapCoproduct(tryNormalizeInterpreted< IntTraits>(lit))
        || [&](){ return wrapCoproduct(tryNormalizeInterpreted< RatTraits>(lit)); }
        || [&](){ return wrapCoproduct(tryNormalizeInterpreted<RealTraits>(lit)); }
        || Option<Out>();
    }